

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binaryfusefilter.h
# Opt level: O1

size_t binary_fuse_sort_and_remove_dup(uint64_t *keys,size_t length)

{
  size_t sVar1;
  size_t sVar2;
  
  qsort(keys,length,8,binary_fuse_cmpfunc);
  sVar1 = 1;
  if (1 < length) {
    sVar2 = 1;
    do {
      if (keys[sVar2] != keys[sVar2 - 1]) {
        keys[sVar1] = keys[sVar2];
        sVar1 = sVar1 + 1;
      }
      sVar2 = sVar2 + 1;
    } while (length != sVar2);
  }
  return sVar1;
}

Assistant:

static size_t binary_fuse_sort_and_remove_dup(uint64_t* keys, size_t length) {
  qsort(keys, length, sizeof(uint64_t), binary_fuse_cmpfunc);
  size_t j = 1;
  for(size_t i = 1; i < length; i++) {
    if(keys[i] != keys[i-1]) {
      keys[j] = keys[i];
      j++;
    }
  }
  return j;
}